

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview_p.h
# Opt level: O0

void __thiscall QTableViewPrivate::~QTableViewPrivate(QTableViewPrivate *this)

{
  QTableViewPrivate *in_RDI;
  
  ~QTableViewPrivate(in_RDI);
  operator_delete(in_RDI,0x670);
  return;
}

Assistant:

class Q_AUTOTEST_EXPORT QTableViewPrivate : public QAbstractItemViewPrivate
{
    Q_DECLARE_PUBLIC(QTableView)
public:
    QTableViewPrivate()
        : showGrid(true), gridStyle(Qt::SolidLine),
          horizontalHeader(nullptr), verticalHeader(nullptr),
          sortingEnabled(false), geometryRecursionBlock(false),
          visualCursor(QPoint())
 {
    wrapItemText = true;
#if QT_CONFIG(draganddrop)
    overwrite = true;
#endif
 }